

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

opj_codestream_index_t * j2k_get_cstr_index(opj_j2k_t *p_j2k)

{
  uint uVar1;
  opj_codestream_index_t *poVar2;
  opj_marker_info_t *__src;
  void *pvVar3;
  OPJ_OFF_T OVar4;
  opj_codestream_index_t *ptr;
  opj_marker_info_t *ptr_00;
  opj_tile_index_t *poVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  
  ptr = (opj_codestream_index_t *)opj_calloc(1,0x38);
  if (ptr != (opj_codestream_index_t *)0x0) {
    poVar2 = p_j2k->cstr_index;
    OVar4 = poVar2->main_head_end;
    ptr->main_head_start = poVar2->main_head_start;
    ptr->main_head_end = OVar4;
    ptr->codestream_size = poVar2->codestream_size;
    uVar1 = poVar2->marknum;
    ptr->marknum = uVar1;
    ptr_00 = (opj_marker_info_t *)opj_malloc((ulong)uVar1 * 0x18);
    ptr->marker = ptr_00;
    if (ptr_00 != (opj_marker_info_t *)0x0) {
      __src = p_j2k->cstr_index->marker;
      if (__src == (opj_marker_info_t *)0x0) {
        opj_free(ptr_00);
        ptr->marker = (opj_marker_info_t *)0x0;
      }
      else {
        memcpy(ptr_00,__src,(ulong)ptr->marknum * 0x18);
      }
      uVar1 = p_j2k->cstr_index->nb_of_tiles;
      ptr->nb_of_tiles = uVar1;
      poVar5 = (opj_tile_index_t *)opj_calloc((ulong)uVar1,0x38);
      ptr->tile_index = poVar5;
      if (poVar5 != (opj_tile_index_t *)0x0) {
        if (p_j2k->cstr_index->tile_index == (opj_tile_index_t *)0x0) {
          opj_free(poVar5);
          ptr->tile_index = (opj_tile_index_t *)0x0;
          return ptr;
        }
        if (ptr->nb_of_tiles == 0) {
          return ptr;
        }
        lVar7 = 0;
        uVar8 = 0;
LAB_0010eb95:
        uVar1 = *(uint *)((long)&p_j2k->cstr_index->tile_index->marknum + lVar7);
        *(uint *)((long)&poVar5->marknum + lVar7) = uVar1;
        pvVar6 = opj_malloc((ulong)uVar1 * 0x18);
        poVar5 = ptr->tile_index;
        *(void **)((long)&poVar5->marker + lVar7) = pvVar6;
        if (pvVar6 == (void *)0x0) {
          if (lVar7 != 0) {
            lVar7 = 0x20;
            do {
              opj_free(*(void **)((long)&ptr->tile_index->tileno + lVar7));
              lVar7 = lVar7 + 0x38;
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
LAB_0010ed10:
            poVar5 = ptr->tile_index;
          }
        }
        else {
          pvVar3 = *(void **)((long)&p_j2k->cstr_index->tile_index->marker + lVar7);
          if (pvVar3 == (void *)0x0) {
            opj_free(pvVar6);
            poVar5 = ptr->tile_index;
            *(undefined8 *)((long)&poVar5->marker + lVar7) = 0;
          }
          else {
            memcpy(pvVar6,pvVar3,(ulong)*(uint *)((long)&poVar5->marknum + lVar7) * 0x18);
            poVar5 = ptr->tile_index;
          }
          uVar1 = *(uint *)((long)&p_j2k->cstr_index->tile_index->nb_tps + lVar7);
          *(uint *)((long)&poVar5->nb_tps + lVar7) = uVar1;
          pvVar6 = opj_malloc((ulong)uVar1 * 0x18);
          poVar5 = ptr->tile_index;
          *(void **)((long)&poVar5->tp_index + lVar7) = pvVar6;
          if (pvVar6 != (void *)0x0) goto code_r0x0010ec42;
          if (lVar7 != 0) {
            lVar7 = 0;
            do {
              opj_free(*(void **)((long)&ptr->tile_index->marker + lVar7));
              opj_free(*(void **)((long)&ptr->tile_index->tp_index + lVar7));
              lVar7 = lVar7 + 0x38;
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
            goto LAB_0010ed10;
          }
        }
        opj_free(poVar5);
      }
      opj_free(ptr->marker);
    }
    opj_free(ptr);
  }
  return (opj_codestream_index_t *)0x0;
code_r0x0010ec42:
  pvVar3 = *(void **)((long)&p_j2k->cstr_index->tile_index->tp_index + lVar7);
  if (pvVar3 == (void *)0x0) {
    opj_free(pvVar6);
    poVar5 = ptr->tile_index;
    *(undefined8 *)((long)&poVar5->tp_index + lVar7) = 0;
  }
  else {
    memcpy(pvVar6,pvVar3,(ulong)*(uint *)((long)&poVar5->nb_tps + lVar7) * 0x18);
    poVar5 = ptr->tile_index;
  }
  *(undefined4 *)((long)&poVar5->nb_packet + lVar7) = 0;
  *(undefined8 *)((long)&poVar5->packet_index + lVar7) = 0;
  uVar8 = uVar8 + 1;
  lVar7 = lVar7 + 0x38;
  if (ptr->nb_of_tiles <= uVar8) {
    return ptr;
  }
  goto LAB_0010eb95;
}

Assistant:

opj_codestream_index_t* j2k_get_cstr_index(opj_j2k_t* p_j2k)
{
        opj_codestream_index_t* l_cstr_index = (opj_codestream_index_t*)
                        opj_calloc(1,sizeof(opj_codestream_index_t));
        if (!l_cstr_index)
                return NULL;

        l_cstr_index->main_head_start = p_j2k->cstr_index->main_head_start;
        l_cstr_index->main_head_end = p_j2k->cstr_index->main_head_end;
        l_cstr_index->codestream_size = p_j2k->cstr_index->codestream_size;

        l_cstr_index->marknum = p_j2k->cstr_index->marknum;
        l_cstr_index->marker = (opj_marker_info_t*)opj_malloc(l_cstr_index->marknum*sizeof(opj_marker_info_t));
        if (!l_cstr_index->marker){
                opj_free( l_cstr_index);
                return NULL;
        }

        if (p_j2k->cstr_index->marker)
                memcpy(l_cstr_index->marker, p_j2k->cstr_index->marker, l_cstr_index->marknum * sizeof(opj_marker_info_t) );
        else{
                opj_free(l_cstr_index->marker);
                l_cstr_index->marker = NULL;
        }

        l_cstr_index->nb_of_tiles = p_j2k->cstr_index->nb_of_tiles;
        l_cstr_index->tile_index = (opj_tile_index_t*)opj_calloc(l_cstr_index->nb_of_tiles, sizeof(opj_tile_index_t) );
        if (!l_cstr_index->tile_index){
                opj_free( l_cstr_index->marker);
                opj_free( l_cstr_index);
                return NULL;
        }

        if (!p_j2k->cstr_index->tile_index){
                opj_free(l_cstr_index->tile_index);
                l_cstr_index->tile_index = NULL;
        }
        else {
                OPJ_UINT32 it_tile = 0;
                for (it_tile = 0; it_tile < l_cstr_index->nb_of_tiles; it_tile++ ){

                        /* Tile Marker*/
                        l_cstr_index->tile_index[it_tile].marknum = p_j2k->cstr_index->tile_index[it_tile].marknum;

                        l_cstr_index->tile_index[it_tile].marker =
                                (opj_marker_info_t*)opj_malloc(l_cstr_index->tile_index[it_tile].marknum*sizeof(opj_marker_info_t));

                        if (!l_cstr_index->tile_index[it_tile].marker) {
                                OPJ_UINT32 it_tile_free;

                                for (it_tile_free=0; it_tile_free < it_tile; it_tile_free++){
                                        opj_free(l_cstr_index->tile_index[it_tile_free].marker);
                                }

                                opj_free( l_cstr_index->tile_index);
                                opj_free( l_cstr_index->marker);
                                opj_free( l_cstr_index);
                                return NULL;
                        }

                        if (p_j2k->cstr_index->tile_index[it_tile].marker)
                                memcpy( l_cstr_index->tile_index[it_tile].marker,
                                                p_j2k->cstr_index->tile_index[it_tile].marker,
                                                l_cstr_index->tile_index[it_tile].marknum * sizeof(opj_marker_info_t) );
                        else{
                                opj_free(l_cstr_index->tile_index[it_tile].marker);
                                l_cstr_index->tile_index[it_tile].marker = NULL;
                        }

                        /* Tile part index*/
                        l_cstr_index->tile_index[it_tile].nb_tps = p_j2k->cstr_index->tile_index[it_tile].nb_tps;

                        l_cstr_index->tile_index[it_tile].tp_index =
                                (opj_tp_index_t*)opj_malloc(l_cstr_index->tile_index[it_tile].nb_tps*sizeof(opj_tp_index_t));

                        if(!l_cstr_index->tile_index[it_tile].tp_index){
                                OPJ_UINT32 it_tile_free;

                                for (it_tile_free=0; it_tile_free < it_tile; it_tile_free++){
                                        opj_free(l_cstr_index->tile_index[it_tile_free].marker);
                                        opj_free(l_cstr_index->tile_index[it_tile_free].tp_index);
                                }

                                opj_free( l_cstr_index->tile_index);
                                opj_free( l_cstr_index->marker);
                                opj_free( l_cstr_index);
                                return NULL;
                        }

                        if (p_j2k->cstr_index->tile_index[it_tile].tp_index){
                                memcpy( l_cstr_index->tile_index[it_tile].tp_index,
                                                p_j2k->cstr_index->tile_index[it_tile].tp_index,
                                                l_cstr_index->tile_index[it_tile].nb_tps * sizeof(opj_tp_index_t) );
                        }
                        else{
                                opj_free(l_cstr_index->tile_index[it_tile].tp_index);
                                l_cstr_index->tile_index[it_tile].tp_index = NULL;
                        }

                        /* Packet index (NOT USED)*/
                        l_cstr_index->tile_index[it_tile].nb_packet = 0;
                        l_cstr_index->tile_index[it_tile].packet_index = NULL;

                }
        }

        return l_cstr_index;
}